

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall
ImFontAtlas::AddCustomRectFontGlyph
          (ImFontAtlas *this,ImFont *font,ImWchar id,int width,int height,float advance_x,
          ImVec2 *offset)

{
  int in_ECX;
  long in_RSI;
  ImFontAtlasCustomRect *in_RDI;
  int in_R8D;
  ImFontAtlasCustomRect r;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 uVar1;
  undefined1 uVar2;
  
  if (in_RSI == 0) {
    __assert_fail("font != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x734,
                  "int ImFontAtlas::AddCustomRectFontGlyph(ImFont *, ImWchar, int, int, float, const ImVec2 &)"
                 );
  }
  uVar2 = 0 < in_ECX && in_ECX < 0x10000;
  if (0 >= in_ECX || in_ECX >= 0x10000) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x735,
                  "int ImFontAtlas::AddCustomRectFontGlyph(ImFont *, ImWchar, int, int, float, const ImVec2 &)"
                 );
  }
  uVar1 = 0 < in_R8D && in_R8D < 0x10000;
  if (0 >= in_R8D || in_R8D >= 0x10000) {
    __assert_fail("height > 0 && height <= 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x736,
                  "int ImFontAtlas::AddCustomRectFontGlyph(ImFont *, ImWchar, int, int, float, const ImVec2 &)"
                 );
  }
  ImFontAtlasCustomRect::ImFontAtlasCustomRect(in_RDI);
  ImVector<ImFontAtlasCustomRect>::push_back
            ((ImVector<ImFontAtlasCustomRect> *)in_RDI,
             (ImFontAtlasCustomRect *)CONCAT17(uVar2,CONCAT16(uVar1,in_stack_ffffffffffffffa8)));
  return (int)in_RDI[2].GlyphOffset.x + -1;
}

Assistant:

int ImFontAtlas::AddCustomRectFontGlyph(ImFont* font, ImWchar id, int width, int height, float advance_x, const ImVec2& offset)
{
#ifdef IMGUI_USE_WCHAR32
    IM_ASSERT(id <= IM_UNICODE_CODEPOINT_MAX);
#endif
    IM_ASSERT(font != NULL);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    r.GlyphID = id;
    r.GlyphAdvanceX = advance_x;
    r.GlyphOffset = offset;
    r.Font = font;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}